

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Entry * __thiscall
kj::Vector<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>::
add<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>
          (Vector<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry> *this,Entry *params)

{
  bool bVar1;
  Entry *pEVar2;
  Entry *params_local;
  Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this_local;
  
  bVar1 = ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::isFull
                    ((ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)
                     this);
  if (bVar1) {
    Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::grow
              ((Vector<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)this,0);
  }
  pEVar2 = fwd<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>(params);
  pEVar2 = ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>::
           add<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry>
                     ((ArrayBuilder<kj::HashMap<capnp::ClientHook*,capnp::ClientHook*>::Entry> *)
                      this,pEVar2);
  return pEVar2;
}

Assistant:

inline T& add(Params&&... params) KJ_LIFETIMEBOUND {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }